

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

void cmSystemTools::ExpandRegistryValues(string *source,KeyWOW64 param_2)

{
  bool bVar1;
  string key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string reg;
  RegularExpression regEntry;
  undefined1 *local_160;
  long local_158;
  undefined1 local_150;
  undefined7 uStack_14f;
  long *local_140 [2];
  long local_130 [2];
  long *local_120 [2];
  long local_110 [2];
  RegularExpression local_100;
  
  local_100.regmatch.startp[0] = (char *)0x0;
  local_100.regmatch.endp[0] = (char *)0x0;
  local_100.regmatch.searchstring = (char *)0x0;
  local_100.program = (char *)0x0;
  cmsys::RegularExpression::compile(&local_100,"\\[(HKEY[^]]*)\\]");
  while( true ) {
    bVar1 = cmsys::RegularExpression::find
                      (&local_100,(source->_M_dataplus)._M_p,&local_100.regmatch);
    if (!bVar1) break;
    if (local_100.regmatch.startp[1] == (char *)0x0) {
      local_160 = &local_150;
      local_158 = 0;
      local_150 = 0;
    }
    else {
      local_160 = &local_150;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_160,local_100.regmatch.startp[1],local_100.regmatch.endp[1]);
    }
    local_120[0] = local_110;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"[","");
    local_140[0] = local_130;
    std::__cxx11::string::_M_construct<char*>((string *)local_140,local_160,local_160 + local_158);
    std::__cxx11::string::append((char *)local_140);
    std::__cxx11::string::_M_append((char *)local_120,(ulong)local_140[0]);
    if (local_140[0] != local_130) {
      operator_delete(local_140[0],local_130[0] + 1);
    }
    cmsys::SystemTools::ReplaceString(source,(char *)local_120[0],"/registry");
    if (local_120[0] != local_110) {
      operator_delete(local_120[0],local_110[0] + 1);
    }
    if (local_160 != &local_150) {
      operator_delete(local_160,CONCAT71(uStack_14f,local_150) + 1);
    }
  }
  if (local_100.program != (char *)0x0) {
    operator_delete__(local_100.program);
  }
  return;
}

Assistant:

void cmSystemTools::ExpandRegistryValues(std::string& source,
                                         KeyWOW64 /*unused*/)
{
  cmsys::RegularExpression regEntry("\\[(HKEY[^]]*)\\]");
  while (regEntry.find(source)) {
    // the arguments are the second match
    std::string key = regEntry.match(1);
    std::string reg = "[";
    reg += key + "]";
    cmSystemTools::ReplaceString(source, reg.c_str(), "/registry");
  }
}